

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

void sqlcheck::CheckSpaghettiQuery(Configuration *state,string *sql_statement,bool *print_statement)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *pbVar1;
  string title;
  string local_d0;
  regex local_b0;
  string local_90;
  regex false_pattern;
  regex true_pattern;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&true_pattern,".+?",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&false_pattern,"pattern must not exist",0x10);
  local_b0._M_flags = 0x10;
  std::locale::locale(&local_b0._M_loc);
  local_b0._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_b0._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  title._M_dataplus._M_p = (pointer)&title.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&title,"Spaghetti Query Alert","");
  pbVar1 = &false_pattern;
  if (499 < sql_statement->_M_string_length) {
    pbVar1 = &true_pattern;
  }
  local_b0._M_flags = pbVar1->_M_flags;
  std::locale::operator=(&local_b0._M_loc,&pbVar1->_M_loc);
  local_b0._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pbVar1->_M_automaton).
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_b0._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(pbVar1->_M_automaton).
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,title._M_dataplus._M_p,
             title._M_dataplus._M_p + title._M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,anon_var_dwarf_7b274,anon_var_dwarf_7b274 + 0x63a);
  CheckPattern(state,sql_statement,print_statement,&local_b0,RISK_LEVEL_LOW,PATTERN_TYPE_QUERY,
               &local_d0,&local_90,true,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)title._M_dataplus._M_p != &title.field_2) {
    operator_delete(title._M_dataplus._M_p);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_b0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&false_pattern);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&true_pattern);
  return;
}

Assistant:

void CheckSpaghettiQuery(Configuration& state,
                         const std::string& sql_statement,
                         bool& print_statement){

  std::regex true_pattern(".+?");
  std::regex false_pattern("pattern must not exist");
  std::regex pattern;

  std::string title = "Spaghetti Query Alert";
  PatternType pattern_type = PatternType::PATTERN_TYPE_QUERY;
  std::size_t spaghetti_query_char_count = 500;

  if(sql_statement.size() >= spaghetti_query_char_count){
    pattern = true_pattern;
  }
  else {
    pattern = false_pattern;
  }

  auto message =
      "● Split up a complex spaghetti query into several simpler queries:  "
      "SQL is a very expressive language—you can accomplish a lot in a single query or statement. "
      "But that doesn't mean it's mandatory or even a good idea to approach every task with the "
      "assumption it has to be done in one line of code. "
      "One common unintended consequence of producing all your results in one query is "
      "a Cartesian product. This happens when two of the tables in the query have no condition "
      "restricting their relationship. Without such a restriction, the join of two tables pairs "
      "each row in the first table to every row in the other table. Each such pairing becomes a "
      "row of the result set, and you end up with many more rows than you expect. "
      "It's important to consider that these queries are simply hard to write, hard to modify, "
      "and hard to debug. You should expect to get regular requests for incremental enhancements "
      "to your database applications. Managers want more complex reports and more fields in a "
      "user interface. If you design intricate, monolithic SQL queries, it's more costly and "
      "time-consuming to make enhancements to them. Your time is worth something, both to you "
      "and to your project. "
      "Split up a complex spaghetti query into several simpler queries. "
      "When you split up a complex SQL query, the result may be many similar queries, "
      "perhaps varying slightly depending on data values. Writing these queries is a chore, "
      "so it's a good application of SQL code generation. "
      "Although SQL makes it seem possible to solve a complex problem in a single line of code, "
      "don't be tempted to build a house of cards.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_LOW,
               pattern_type,
               title,
               message,
               true);

}